

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfLut.h
# Opt level: O0

void __thiscall
Imf_3_4::HalfLut::HalfLut<Imath_3_2::half(*)(Imath_3_2::half)>(HalfLut *this,_func_half_half *f)

{
  half hVar1;
  half hVar2;
  _func_half_half *in_RSI;
  float in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffe0;
  half in_stack_ffffffffffffffec;
  half in_stack_ffffffffffffffee;
  _func_half_half *p_Var3;
  
  p_Var3 = in_RSI;
  Imath_3_2::half::half
            ((half *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc);
  Imath_3_2::half::half
            ((half *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc);
  Imath_3_2::half::half
            ((half *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbc);
  Imath_3_2::half::posInf();
  hVar1 = Imath_3_2::half::negInf();
  hVar2 = Imath_3_2::half::qNan();
  halfFunction<Imath_3_2::half>::halfFunction<Imath_3_2::half(*)(Imath_3_2::half)>
            ((halfFunction<Imath_3_2::half> *)
             CONCAT26(hVar1._h,CONCAT24(hVar2._h,in_stack_ffffffffffffffe0)),in_RSI,
             (half)(uint16_t)((ulong)p_Var3 >> 0x30),(half)(uint16_t)((ulong)p_Var3 >> 0x20),
             (half)(uint16_t)((ulong)p_Var3 >> 0x10),(half)(uint16_t)p_Var3,
             in_stack_ffffffffffffffee,in_stack_ffffffffffffffec);
  return;
}

Assistant:

HalfLut::HalfLut (Function f)
    : _lut (
          f,
          -HALF_MAX,
          HALF_MAX,
          half (0),
          half::posInf (),
          half::negInf (),
          half::qNan ())
{
    // empty
}